

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SpanTests.cpp
# Opt level: O0

int testSpanTestsMakeSpanVectorMutable(void)

{
  initializer_list<int> __l;
  bool bVar1;
  size_t sVar2;
  ostream *poVar3;
  pointer ptVar4;
  int *piVar5;
  Span<int,_18446744073709551615UL> SVar6;
  undefined1 local_70 [8];
  Span<int,_18446744073709551615UL> span;
  allocator<int> local_49;
  int local_48 [4];
  iterator local_38;
  size_type local_30;
  undefined1 local_28 [8];
  vector<int,_std::allocator<int>_> values;
  
  local_48[0] = 1;
  local_48[1] = 2;
  local_48[2] = 3;
  local_48[3] = 4;
  local_38 = local_48;
  local_30 = 4;
  std::allocator<int>::allocator(&local_49);
  __l._M_len = local_30;
  __l._M_array = local_38;
  std::vector<int,_std::allocator<int>_>::vector
            ((vector<int,_std::allocator<int>_> *)local_28,__l,&local_49);
  std::allocator<int>::~allocator(&local_49);
  SVar6 = MILBlob::Util::MakeSpan<int,_std::vector,_std::allocator<int>_>
                    ((vector<int,_std::allocator<int>_> *)local_28);
  span.m_ptr = (pointer)SVar6.m_size.m_size;
  local_70 = (undefined1  [8])SVar6.m_ptr;
  bVar1 = MILBlob::Util::Span<int,_18446744073709551615UL>::IsEmpty
                    ((Span<int,_18446744073709551615UL> *)local_70);
  if (bVar1) {
    poVar3 = std::operator<<((ostream *)&std::cout,
                             "/workspace/llm4binary/github/license_all_cmakelists_25/hollance[P]coremltools/mlmodel/tests/MILBlob/SpanTests.cpp"
                            );
    poVar3 = std::operator<<(poVar3,":");
    poVar3 = (ostream *)std::ostream::operator<<(poVar3,0x33);
    poVar3 = std::operator<<(poVar3,": error: ");
    poVar3 = std::operator<<(poVar3,"!span.IsEmpty()");
    poVar3 = std::operator<<(poVar3," was false, expected true.");
    std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
    values.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
    _M_end_of_storage._4_4_ = 1;
  }
  else {
    sVar2 = MILBlob::Util::Span<int,_18446744073709551615UL>::Size
                      ((Span<int,_18446744073709551615UL> *)local_70);
    if (sVar2 == 4) {
      ptVar4 = MILBlob::Util::Span<int,_18446744073709551615UL>::Data
                         ((Span<int,_18446744073709551615UL> *)local_70);
      piVar5 = std::vector<int,_std::allocator<int>_>::data
                         ((vector<int,_std::allocator<int>_> *)local_28);
      if (ptVar4 == piVar5) {
        values.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
        _M_end_of_storage._4_4_ = 0;
      }
      else {
        poVar3 = std::operator<<((ostream *)&std::cout,
                                 "/workspace/llm4binary/github/license_all_cmakelists_25/hollance[P]coremltools/mlmodel/tests/MILBlob/SpanTests.cpp"
                                );
        poVar3 = std::operator<<(poVar3,":");
        poVar3 = (ostream *)std::ostream::operator<<(poVar3,0x35);
        poVar3 = std::operator<<(poVar3,": error: ");
        poVar3 = std::operator<<(poVar3,"(span.Data()) == (values.data())");
        poVar3 = std::operator<<(poVar3," was false, expected true.");
        std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
        values.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
        _M_end_of_storage._4_4_ = 1;
      }
    }
    else {
      poVar3 = std::operator<<((ostream *)&std::cout,
                               "/workspace/llm4binary/github/license_all_cmakelists_25/hollance[P]coremltools/mlmodel/tests/MILBlob/SpanTests.cpp"
                              );
      poVar3 = std::operator<<(poVar3,":");
      poVar3 = (ostream *)std::ostream::operator<<(poVar3,0x34);
      poVar3 = std::operator<<(poVar3,": error: ");
      poVar3 = std::operator<<(poVar3,"(span.Size()) == (size_t(4))");
      poVar3 = std::operator<<(poVar3," was false, expected true.");
      std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
      values.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_end_of_storage._4_4_ = 1;
    }
  }
  std::vector<int,_std::allocator<int>_>::~vector((vector<int,_std::allocator<int>_> *)local_28);
  return values.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
         _M_end_of_storage._4_4_;
}

Assistant:

int testSpanTestsMakeSpanVectorMutable()
{
    std::vector<int> values = {1, 2, 3, 4};
    auto span = MakeSpan(values);
    static_assert(std::is_same<decltype(span)::value_type, int>::value, "MakeSpan should make non-const T");

    ML_ASSERT(!span.IsEmpty());
    ML_ASSERT_EQ(span.Size(), size_t(4));
    ML_ASSERT_EQ(span.Data(), values.data());

    return 0;
}